

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccm.c
# Opt level: O3

int ccm_calculate_first_block_if_ready(mbedtls_ccm_context *ctx)

{
  int iVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  size_t local_18;
  size_t olen;
  
  iVar1 = 0;
  if ((~ctx->state & 3U) == 0) {
    local_18 = 0;
    if (ctx->tag_len == 0) {
      if ((ctx->mode & 0xfffffffe) != 2) {
        return -0xd;
      }
      ctx->plaintext_len = 0;
      uVar2 = 0;
    }
    else {
      uVar2 = ctx->plaintext_len;
    }
    ctx->y[0] = (char)ctx->q - 1U | (ctx->add_len != 0) << 6 |
                ((byte)ctx->tag_len & 0x3e) * '\x04' - 8 | ctx->y[0];
    if (ctx->q != 0) {
      uVar4 = 0;
      bVar3 = 1;
      do {
        *(char *)((long)ctx + (0xf - (long)(int)uVar4)) = (char)uVar2;
        uVar2 = uVar2 >> 8;
        uVar4 = (uint)bVar3;
        bVar3 = bVar3 + 1;
      } while (uVar4 < ctx->q);
    }
    iVar1 = -0xd;
    if ((uVar2 == 0) &&
       (iVar1 = mbedtls_cipher_update(&ctx->cipher_ctx,ctx->y,0x10,ctx->y,&local_18), iVar1 == 0)) {
      return 0;
    }
    *(byte *)&ctx->state = (byte)ctx->state | 0x10;
  }
  return iVar1;
}

Assistant:

static int ccm_calculate_first_block_if_ready(mbedtls_ccm_context *ctx)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char i;
    size_t len_left, olen;

    /* length calculation can be done only after both
     * mbedtls_ccm_starts() and mbedtls_ccm_set_lengths() have been executed
     */
    if (!(ctx->state & CCM_STATE__STARTED) || !(ctx->state & CCM_STATE__LENGTHS_SET)) {
        return 0;
    }

    /* CCM expects non-empty tag.
     * CCM* allows empty tag. For CCM* without tag, ignore plaintext length.
     */
    if (ctx->tag_len == 0) {
        if (ctx->mode == MBEDTLS_CCM_STAR_ENCRYPT || ctx->mode == MBEDTLS_CCM_STAR_DECRYPT) {
            ctx->plaintext_len = 0;
        } else {
            return MBEDTLS_ERR_CCM_BAD_INPUT;
        }
    }

    /*
     * First block:
     * 0        .. 0        flags
     * 1        .. iv_len   nonce (aka iv)  - set by: mbedtls_ccm_starts()
     * iv_len+1 .. 15       length
     *
     * With flags as (bits):
     * 7        0
     * 6        add present?
     * 5 .. 3   (t - 2) / 2
     * 2 .. 0   q - 1
     */
    ctx->y[0] |= (ctx->add_len > 0) << 6;
    ctx->y[0] |= ((ctx->tag_len - 2) / 2) << 3;
    ctx->y[0] |= ctx->q - 1;

    for (i = 0, len_left = ctx->plaintext_len; i < ctx->q; i++, len_left >>= 8) {
        ctx->y[15-i] = MBEDTLS_BYTE_0(len_left);
    }

    if (len_left > 0) {
        ctx->state |= CCM_STATE__ERROR;
        return MBEDTLS_ERR_CCM_BAD_INPUT;
    }

    /* Start CBC-MAC with first block*/
    if ((ret = mbedtls_cipher_update(&ctx->cipher_ctx, ctx->y, 16, ctx->y, &olen)) != 0) {
        ctx->state |= CCM_STATE__ERROR;
        return ret;
    }

    return 0;
}